

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc-parse.c
# Opt level: O3

void ZCCParseFree(void *p,_func_void_void_ptr *freeProc)

{
  yyParser_conflict *pParser;
  
  if (p == (void *)0x0) {
    return;
  }
  while (-1 < *p) {
    yy_pop_parser_stack((yyParser_conflict *)p);
  }
  (*freeProc)(p);
  return;
}

Assistant:

void ZCCParseFree(
  void *p,                    /* The parser to be deleted */
  void (CDECL *freeProc)(void*)     /* Function used to reclaim memory */
){
  yyParser *pParser = (yyParser*)p;
#ifndef YYPARSEFREENEVERNULL
  if( pParser==0 ) return;
#endif
  while( pParser->yyidx>=0 ) yy_pop_parser_stack(pParser);
#if YYSTACKDEPTH<=0
  free(pParser->yystack);
#endif
  (*freeProc)((void*)pParser);
}